

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woz.cpp
# Opt level: O0

bool ReadWOZ(MemFile *file,shared_ptr<Disk> *disk)

{
  byte bVar1;
  bool bVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  ulong extraout_RAX;
  ulong uVar8;
  uchar *buf;
  exception *peVar9;
  ulong uVar10;
  reference pvVar11;
  reference pvVar12;
  byte *pbVar13;
  size_type sVar14;
  char *pcVar15;
  reference pvVar16;
  reference __k;
  mapped_type *pmVar17;
  element_type *peVar18;
  value_type *in_RCX;
  undefined1 local_3c0 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  columns;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *row;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_358 [8];
  string str_meta;
  undefined1 local_330 [8];
  vector<char,_std::allocator<char>_> meta;
  CylHead cylhead;
  uint16_t splicepos;
  BitBuffer bitbuf;
  value_type *trk;
  size_t i_1;
  pointer pTStack_288;
  int cyl_step;
  size_t i;
  undefined1 local_278 [8];
  vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_> trks;
  unsigned_long tracks;
  key_type local_250;
  undefined1 local_229 [33];
  string local_208;
  allocator<char> local_1e1;
  key_type local_1e0;
  allocator<char> local_1b9;
  key_type local_1b8;
  allocator<char> local_191;
  key_type local_190;
  allocator<char> local_169;
  key_type local_168;
  byte local_144;
  allocator<char> local_143;
  byte local_142;
  allocator<char> local_141;
  string local_140;
  int local_10c;
  uint local_108;
  uint32_t next_pos;
  uint32_t chunk_size;
  uint32_t chunk_id;
  WOZ_CHUNK wc;
  TMAP_CHUNK tmap;
  INFO_CHUNK_conflict info;
  uint32_t crc;
  WOZ_HEADER wh;
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  wh._4_8_ = disk;
  MemFile::rewind(file,(FILE *)disk);
  if ((((extraout_RAX & 1) == 0) ||
      (uVar8 = MemFile::read(file,(int)&info + 0x21,(void *)0xc,(size_t)in_RCX), (uVar8 & 1) == 0))
     || (info.creator._28_4_ != 0x315a4f57)) {
    file_local._7_1_ = false;
  }
  else if (((char)crc == -1) && (iVar5 = memcmp((void *)((long)&crc + 1),"\n\r\n",3), iVar5 == 0)) {
    info.creator._24_4_ = util::le_value<4,_nullptr>((uint8_t (*) [4])&wh);
    if (info.creator._24_4_ != 0) {
      buf = MemFile::ptr<unsigned_char>(file);
      iVar5 = MemFile::size(file);
      uVar6 = MemFile::tell(file);
      in_RCX = (value_type *)(ulong)uVar6;
      uVar7 = crc32(buf,(long)(int)(iVar5 - uVar6));
      if (uVar7 != info.creator._24_4_) {
        Message<>(msgWarning,"file checksum is incorrect!");
      }
    }
    memset(tmap.map._M_elems + 0x98,0,0x25);
    memset(&wc,0,0xa0);
    memset((void *)((long)&chunk_size + 3),0,8);
    while (uVar8 = MemFile::read(file,(int)&chunk_size + 3,(void *)0x8,(size_t)in_RCX),
          (uVar8 & 1) != 0) {
      next_pos = util::be_value<4,_nullptr>((uint8_t (*) [4])((long)&chunk_size + 3));
      local_108 = util::le_value<4,_nullptr>((uint8_t (*) [4])((long)&chunk_id + 3));
      local_10c = MemFile::tell(file);
      in_RCX = (value_type *)(ulong)local_108;
      local_10c = local_10c + local_108;
      if (next_pos == 0x494e464f) {
        uVar8 = MemFile::read(file,(int)&tmap + 0x98,(void *)0x25,(size_t)in_RCX);
        if ((uVar8 & 1) == 0) {
          peVar9 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[24]>
                    (peVar9,(char (*) [24])"short file reading info");
          __cxa_throw(peVar9,&util::exception::typeinfo,util::exception::~exception);
        }
        local_142 = 0;
        local_144 = 0;
        if (tmap.map._M_elems[0x99] == '\x01') {
          std::allocator<char>::allocator();
          local_142 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_140,"5.25\"",&local_141);
        }
        else if (tmap.map._M_elems[0x99] == '\x02') {
          std::allocator<char>::allocator();
          local_144 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_140,"3.5\"",&local_143);
        }
        else {
          std::__cxx11::to_string(&local_140,(uint)tmap.map._M_elems[0x99]);
        }
        peVar18 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             wh._4_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_168,"disk_type",&local_169);
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&peVar18->metadata,&local_168);
        std::__cxx11::string::operator=((string *)pmVar17,(string *)&local_140);
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator(&local_169);
        std::__cxx11::string::~string((string *)&local_140);
        if ((local_144 & 1) != 0) {
          std::allocator<char>::~allocator(&local_143);
        }
        if ((local_142 & 1) != 0) {
          std::allocator<char>::~allocator(&local_141);
        }
        pcVar15 = "no";
        if (tmap.map._M_elems[0x9a] != '\0') {
          pcVar15 = "yes";
        }
        peVar18 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             wh._4_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,"read_only",&local_191);
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&peVar18->metadata,&local_190);
        std::__cxx11::string::operator=((string *)pmVar17,pcVar15);
        std::__cxx11::string::~string((string *)&local_190);
        std::allocator<char>::~allocator(&local_191);
        pcVar15 = "no";
        if (tmap.map._M_elems[0x9b] != '\0') {
          pcVar15 = "yes";
        }
        peVar18 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             wh._4_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b8,"synchronised",&local_1b9);
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&peVar18->metadata,&local_1b8);
        std::__cxx11::string::operator=((string *)pmVar17,pcVar15);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator(&local_1b9);
        pcVar15 = "no";
        if (tmap.map._M_elems[0x9c] != '\0') {
          pcVar15 = "yes";
        }
        peVar18 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             wh._4_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e0,"cleaned",&local_1e1);
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&peVar18->metadata,&local_1e0);
        std::__cxx11::string::operator=((string *)pmVar17,pcVar15);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator(&local_1e1);
        in_RCX = (value_type *)local_229;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_229 + 1),(char *)(tmap.map._M_elems + 0x9d),0x20,
                   (allocator *)in_RCX);
        util::trim(&local_208,(string *)(local_229 + 1));
        peVar18 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             wh._4_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_250,"creator",(allocator<char> *)((long)&tracks + 7));
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&peVar18->metadata,&local_250);
        std::__cxx11::string::operator=((string *)pmVar17,(string *)&local_208);
        std::__cxx11::string::~string((string *)&local_250);
        std::allocator<char>::~allocator((allocator<char> *)((long)&tracks + 7));
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)(local_229 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_229);
      }
      else if (next_pos == 0x4d455441) {
        uVar8 = (ulong)local_108;
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_330,uVar8,
                   (allocator_type *)(str_meta.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(str_meta.field_2._M_local_buf + 0xf));
        bVar2 = MemFile::read<std::vector<char,std::allocator<char>>>
                          (file,(vector<char,_std::allocator<char>_> *)local_330);
        if (!bVar2) {
          peVar9 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[30]>
                    (peVar9,(char (*) [30])"short file reading meta chunk");
          __cxa_throw(peVar9,&util::exception::typeinfo,util::exception::~exception);
        }
        pcVar15 = std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)local_330);
        sVar14 = std::vector<char,_std::allocator<char>_>::size
                           ((vector<char,_std::allocator<char>_> *)local_330);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_358,pcVar15,sVar14,(allocator *)((long)&__range3 + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
        in_RCX = (value_type *)0x0;
        util::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__begin3,(string *)local_358,'\n',false);
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__begin3);
        row = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__begin3);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&row), bVar2) {
          columns.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end3);
          in_RCX = (value_type *)0x0;
          util::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_3c0 + 0x10),
                      columns.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,'\t',false);
          sVar14 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_3c0 + 0x10));
          if (sVar14 == 2) {
            pvVar16 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)(local_3c0 + 0x10),1);
            peVar18 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)wh._4_8_);
            __k = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(local_3c0 + 0x10),0);
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&peVar18->metadata,__k);
            std::__cxx11::string::operator=((string *)pmVar17,(string *)pvVar16);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_3c0 + 0x10));
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__begin3);
        std::__cxx11::string::~string((string *)local_358);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_330);
      }
      else if (next_pos == 0x544d4150) {
        uVar8 = MemFile::read(file,(int)&wc,(void *)0xa0,(size_t)in_RCX);
        if ((uVar8 & 1) == 0) {
          peVar9 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[29]>
                    (peVar9,(char (*) [29])"short file reading track map");
          __cxa_throw(peVar9,&util::exception::typeinfo,util::exception::~exception);
        }
      }
      else if (next_pos == 0x54524b53) {
        if ((ulong)local_108 % 0x1a00 != 0) {
          peVar9 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[31]>
                    (peVar9,(char (*) [31])"TRKS chunk size is mis-aligned");
          __cxa_throw(peVar9,&util::exception::typeinfo,util::exception::~exception);
        }
        uVar10 = (ulong)local_108;
        uVar8 = 0x9d89d89d89d8a;
        trks.super__Vector_base<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(uVar10 / 0x1a00);
        std::allocator<TRKS_CHUNK>::allocator((allocator<TRKS_CHUNK> *)((long)&i + 7));
        std::vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_>::vector
                  ((vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_> *)local_278,
                   (size_type)(uVar10 / 0x1a00),(allocator<TRKS_CHUNK> *)((long)&i + 7));
        std::allocator<TRKS_CHUNK>::~allocator((allocator<TRKS_CHUNK> *)((long)&i + 7));
        for (pTStack_288 = (pointer)0x0;
            pTStack_288 <
            trks.super__Vector_base<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
            pTStack_288 = (pointer)(pTStack_288->data + 1)) {
          pvVar11 = std::vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_>::operator[]
                              ((vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_> *)local_278,
                               (size_type)pTStack_288);
          uVar8 = MemFile::read(file,(int)pvVar11,(void *)0x1a00,uVar8);
          if ((uVar8 & 1) == 0) {
            peVar9 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<char_const(&)[30]>
                      (peVar9,(char (*) [30])"short file reading track data");
            __cxa_throw(peVar9,&util::exception::typeinfo,util::exception::~exception);
          }
          pvVar11 = std::vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_>::operator[]
                              ((vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_> *)local_278,
                               (size_type)pTStack_288);
          uVar3 = util::le_value<2,_nullptr>(&pvVar11->used_bytes);
          pvVar11 = std::vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_>::operator[]
                              ((vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_> *)local_278,
                               (size_type)pTStack_288);
          uVar4 = util::le_value<2,_nullptr>(&pvVar11->used_bits);
          uVar8 = (ulong)(uVar4 + 7) / 8;
          if ((uint)uVar3 != (uint)uVar8) {
            peVar9 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<char_const(&)[39],unsigned_long&>
                      (peVar9,(char (*) [39])"bit/byte counts inconsistent on track ",
                       (unsigned_long *)&stack0xfffffffffffffd78);
            __cxa_throw(peVar9,&util::exception::typeinfo,util::exception::~exception);
          }
          pvVar11 = std::vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_>::operator[]
                              ((vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_> *)local_278,
                               (size_type)pTStack_288);
          pvVar12 = std::vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_>::operator[]
                              ((vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_> *)local_278,
                               (size_type)pTStack_288);
          uVar3 = util::le_value<2,_nullptr>(&pvVar12->used_bytes);
          util::bit_reverse(pvVar11->data,(uint)uVar3);
        }
        iVar5 = 1;
        if (tmap.map._M_elems[0x99] == '\x01') {
          iVar5 = 4;
        }
        for (trk = (value_type *)0x0;
            in_RCX = (value_type *)
                     std::array<unsigned_char,_160UL>::size((array<unsigned_char,_160UL> *)&wc),
            trk < in_RCX; trk = (value_type *)(trk->data + iVar5)) {
          pbVar13 = std::array<unsigned_char,_160UL>::operator[]
                              ((array<unsigned_char,_160UL> *)&wc,(size_type)trk);
          bVar1 = *pbVar13;
          sVar14 = std::vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_>::size
                             ((vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_> *)local_278);
          if (bVar1 < sVar14) {
            pbVar13 = std::array<unsigned_char,_160UL>::operator[]
                                ((array<unsigned_char,_160UL> *)&wc,(size_type)trk);
            pvVar11 = std::vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_>::operator[]
                                ((vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_> *)local_278,
                                 (ulong)*pbVar13);
            uVar3 = util::le_value<2,_nullptr>(&pvVar11->used_bits);
            BitBuffer::BitBuffer((BitBuffer *)&cylhead.head,_250K,pvVar11->data,(uint)uVar3);
            cylhead.cyl._2_2_ = util::le_value<2,_nullptr>(&pvVar11->splice_pos);
            if (cylhead.cyl._2_2_ != 0xffff) {
              BitBuffer::splicepos((BitBuffer *)&cylhead.head,(uint)cylhead.cyl._2_2_);
            }
            pbVar13 = std::array<unsigned_char,_160UL>::operator[]
                                ((array<unsigned_char,_160UL> *)&wc,(size_type)trk);
            bVar1 = *pbVar13;
            sVar14 = std::vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_>::size
                               ((vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_> *)local_278);
            CylHead::CylHead((CylHead *)
                             &meta.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              field_0x14,(uint)bVar1,
                             (int)(((ulong)trk / (ulong)(long)iVar5) / sVar14));
            peVar18 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)wh._4_8_);
            Disk::write(peVar18,(int)&meta + 0x14,&cylhead.head,sVar14);
            BitBuffer::~BitBuffer((BitBuffer *)&cylhead.head);
          }
        }
        std::vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_>::~vector
                  ((vector<TRKS_CHUNK,_std::allocator<TRKS_CHUNK>_> *)local_278);
      }
      else {
        local_3c0[8] = '\x04';
        local_3c0[9] = '\0';
        local_3c0[10] = '\0';
        local_3c0[0xb] = '\0';
        local_3c0[0xc] = '\0';
        local_3c0[0xd] = '\0';
        local_3c0[0xe] = '\0';
        local_3c0[0xf] = '\0';
        local_3c0._0_8_ = (long)&chunk_size + 3;
        in_RCX = (value_type *)local_3c0;
        Message<unsigned_long,char_const*,unsigned_char&,unsigned_char&,unsigned_char&,unsigned_char&,unsigned_int&>
                  (msgWarning,"unknown WOZ chunk: %.*s [%02X %02X %02X %02X] with size %u",
                   (unsigned_long *)(local_3c0 + 8),(char **)in_RCX,(uchar *)((long)&chunk_size + 3)
                   ,(uchar *)&chunk_id,(uchar *)((long)&chunk_id + 1),(uchar *)((long)&chunk_id + 2)
                   ,&local_108);
        iVar5 = MemFile::tell(file);
        MemFile::seek(file,iVar5 + local_108);
      }
      MemFile::seek(file,local_10c);
    }
    peVar18 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         wh._4_8_);
    std::__cxx11::string::operator=((string *)&peVar18->strType,"WOZ");
    file_local._7_1_ = true;
  }
  else {
    file_local._7_1_ = false;
  }
  return file_local._7_1_;
}

Assistant:

bool ReadWOZ(MemFile& file, std::shared_ptr<Disk>& disk)
{
    WOZ_HEADER wh;
    if (!file.rewind() || !file.read(&wh, sizeof(wh)) || memcmp(&wh.sig, WOZ_SIGNATURE, sizeof(wh.sig)))
        return false;
    else if (wh.ff != 0xff || memcmp(&wh.lfcrlf, "\n\r\n", 3))
        return false;

    auto crc = util::le_value(wh.crc32);
    if (crc && crc32(file.ptr<uint8_t>(), file.size() - file.tell()) != crc)
        Message(msgWarning, "file checksum is incorrect!");

    INFO_CHUNK info{};
    TMAP_CHUNK tmap{};
    WOZ_CHUNK wc{};

    while (file.read(&wc, sizeof(wc)))
    {
        auto chunk_id = util::be_value(wc.type);    // big-endian for text
        auto chunk_size = util::le_value(wc.size);
        auto next_pos = file.tell() + chunk_size;

        switch (chunk_id)
        {
        case id_value("INFO"):
        {
            if (!file.read(&info, sizeof(info)))
                throw util::exception("short file reading info");

            disk->metadata["disk_type"] = (info.disk_type == 1) ? "5.25\"" :
                (info.disk_type == 2) ? "3.5\"" : std::to_string(info.disk_type);
            disk->metadata["read_only"] = info.write_protect ? "yes" : "no";
            disk->metadata["synchronised"] = info.synchronised ? "yes" : "no";
            disk->metadata["cleaned"] = info.cleaned ? "yes" : "no";
            disk->metadata["creator"] =
                util::trim(std::string(info.creator, sizeof(info.creator)));
            break;
        }

        case id_value("TMAP"):
            if (!file.read(&tmap, sizeof(tmap)))
                throw util::exception("short file reading track map");
            break;

        case id_value("TRKS"):
        {
            if (chunk_size % sizeof(TRKS_CHUNK))
                throw util::exception("TRKS chunk size is mis-aligned");

            auto tracks = chunk_size / sizeof(TRKS_CHUNK);
            std::vector<TRKS_CHUNK> trks(tracks);

            for (size_t i = 0; i < tracks; ++i)
            {
                if (!file.read(&trks[i], sizeof(trks[i])))
                    throw util::exception("short file reading track data");
                else if (util::le_value(trks[i].used_bytes) !=
                    (util::le_value(trks[i].used_bits) + 7) / 8)
                    throw util::exception("bit/byte counts inconsistent on track ", i);

                util::bit_reverse(trks[i].data, util::le_value(trks[i].used_bytes));
            }

            int cyl_step = (info.disk_type == 1) ? 4 : 1;
            for (size_t i = 0; i < tmap.map.size(); i += cyl_step)
            {
                if (tmap.map[i] < trks.size())
                {
                    auto& trk = trks[tmap.map[i]];
                    BitBuffer bitbuf(DataRate::_250K, trk.data, util::le_value(trk.used_bits));

                    auto splicepos = util::le_value(trk.splice_pos);
                    if (splicepos != 0xffff)
                        bitbuf.splicepos(splicepos);

                    auto cylhead = CylHead(tmap.map[i], static_cast<int>((i / cyl_step) / trks.size()));
                    disk->write(cylhead, std::move(bitbuf));
                }
            }
            break;
        }

        case id_value("META"):
        {
            std::vector<char> meta(chunk_size);
            if (!file.read(meta))
                throw util::exception("short file reading meta chunk");

            auto str_meta = std::string(meta.data(), meta.size());
            for (auto& row : util::split(str_meta, '\n'))
            {
                auto columns = util::split(row, '\t');
                if (columns.size() == 2)
                    disk->metadata[columns[0]] = columns[1];
            }
            break;
        }

        default:
            Message(msgWarning, "unknown WOZ chunk: %.*s [%02X %02X %02X %02X] with size %u",
                sizeof(wc.type), reinterpret_cast<const char*>(wc.type),
                wc.type[0], wc.type[1], wc.type[2], wc.type[3], chunk_size);

            file.seek(file.tell() + chunk_size);
            break;
        }

        file.seek(next_pos);
    }

    disk->strType = "WOZ";
    return true;
}